

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O1

int run_test_tcp6_local_connect_timeout(void)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  short *psVar5;
  uv_tcp_t *puVar6;
  bool bVar7;
  int64_t eval_a;
  int64_t eval_b;
  sockaddr_in6 addr;
  int local_40;
  uv_loop_t *local_38;
  long local_30;
  
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    run_test_tcp6_local_connect_timeout_cold_10();
    return 7;
  }
  iVar2 = uv_interface_addresses(&stack0xffffffffffffffd0,&stack0xffffffffffffffc0);
  if (iVar2 != 0) {
LAB_001cb15e:
    run_test_tcp6_local_connect_timeout_cold_1();
    return 7;
  }
  if ((long)local_40 < 1) {
    uv_free_interface_addresses();
    goto LAB_001cb15e;
  }
  psVar5 = (short *)(local_30 + 0x14);
  uVar3 = 1;
  do {
    sVar1 = *psVar5;
    if (sVar1 == 10) break;
    psVar5 = psVar5 + 0x30;
    bVar7 = uVar3 < (ulong)(long)local_40;
    uVar3 = uVar3 + 1;
  } while (bVar7);
  uv_free_interface_addresses(local_30);
  if (sVar1 != 10) goto LAB_001cb15e;
  iVar2 = uv_ip6_addr("::1",9999,&stack0xffffffffffffffd0);
  _local_40 = (uv_loop_t *)(long)iVar2;
  local_38 = (uv_loop_t *)0x0;
  if (_local_40 == (uv_loop_t *)0x0) {
    uVar4 = uv_default_loop();
    iVar2 = uv_timer_init(uVar4,&timer);
    _local_40 = (uv_loop_t *)(long)iVar2;
    local_38 = (uv_loop_t *)0x0;
    if (_local_40 != (uv_loop_t *)0x0) goto LAB_001cb188;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    _local_40 = (uv_loop_t *)(long)iVar2;
    local_38 = (uv_loop_t *)0x0;
    if (_local_40 != (uv_loop_t *)0x0) goto LAB_001cb197;
    uVar4 = uv_default_loop();
    iVar2 = uv_tcp_init(uVar4,&conn);
    _local_40 = (uv_loop_t *)(long)iVar2;
    local_38 = (uv_loop_t *)0x0;
    if (_local_40 != (uv_loop_t *)0x0) goto LAB_001cb1a6;
    iVar2 = uv_tcp_connect(&connect_req,&conn,&stack0xffffffffffffffd0,connect_local_cb);
    if (iVar2 == -0x65) {
      run_test_tcp6_local_connect_timeout_cold_9();
      return 7;
    }
    _local_40 = (uv_loop_t *)(long)iVar2;
    local_38 = (uv_loop_t *)0x0;
    if (_local_40 != (uv_loop_t *)0x0) goto LAB_001cb1b5;
    uVar4 = uv_default_loop();
    iVar2 = uv_run(uVar4,0);
    _local_40 = (uv_loop_t *)(long)iVar2;
    local_38 = (uv_loop_t *)0x0;
    if (_local_40 == (uv_loop_t *)0x0) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      _local_40 = (uv_loop_t *)0x0;
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      local_38 = (uv_loop_t *)(long)iVar2;
      if (_local_40 == local_38) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001cb1d3;
    }
  }
  else {
    run_test_tcp6_local_connect_timeout_cold_2();
LAB_001cb188:
    run_test_tcp6_local_connect_timeout_cold_3();
LAB_001cb197:
    run_test_tcp6_local_connect_timeout_cold_4();
LAB_001cb1a6:
    run_test_tcp6_local_connect_timeout_cold_5();
LAB_001cb1b5:
    run_test_tcp6_local_connect_timeout_cold_6();
  }
  run_test_tcp6_local_connect_timeout_cold_7();
LAB_001cb1d3:
  puVar6 = (uv_tcp_t *)&stack0xffffffffffffffc0;
  run_test_tcp6_local_connect_timeout_cold_8();
  if (puVar6 == (uv_tcp_t *)&timer || puVar6 == &conn) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x37f0,puVar6 == &conn);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(puVar6,0);
  return iVar2;
}

Assistant:

TEST_IMPL(tcp6_local_connect_timeout) {
  struct sockaddr_in6 addr;
  int r;

  if (!is_supported_system()) {
    RETURN_SKIP("Unsupported system");
  }
  if (!can_ipv6()) {
    RETURN_SKIP("IPv6 not supported");
  }

  ASSERT_OK(uv_ip6_addr("::1", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* Give it 1s to timeout. */
  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_local_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}